

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_set_all_gej(secp256k1_ge *r,secp256k1_gej *a,size_t len)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  int iVar6;
  secp256k1_ge *psVar7;
  secp256k1_gej *a_00;
  secp256k1_fe *psVar8;
  size_t sVar9;
  long lVar10;
  bool bVar11;
  secp256k1_fe u;
  
  sVar9 = 0xffffffffffffffff;
  a_00 = a;
  do {
    sVar9 = sVar9 + 1;
    if (len == sVar9) {
      if (len != 0) {
        uVar1 = (a->z).n[0];
        uVar2 = (a->z).n[1];
        uVar3 = (a->z).n[2];
        uVar4 = (a->z).n[3];
        iVar6 = (a->z).magnitude;
        iVar5 = (a->z).normalized;
        (r->x).n[4] = (a->z).n[4];
        (r->x).magnitude = iVar6;
        (r->x).normalized = iVar5;
        (r->x).n[2] = uVar3;
        (r->x).n[3] = uVar4;
        (r->x).n[0] = uVar1;
        (r->x).n[1] = uVar2;
        lVar10 = len - 1;
        psVar8 = &a[1].z;
        psVar7 = r;
        while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
          secp256k1_fe_mul(&psVar7[1].x,&psVar7->x,psVar8);
          psVar8 = (secp256k1_fe *)(psVar8[3].n + 1);
          psVar7 = psVar7 + 1;
        }
        lVar10 = len - 1;
        secp256k1_fe_inv(&u,&r[len - 1].x);
        psVar8 = &a[len - 1].z;
        psVar7 = r + (len - 2);
        while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
          secp256k1_fe_mul(&psVar7[1].x,&psVar7->x,&u);
          secp256k1_fe_mul(&u,&u,psVar8);
          psVar8 = (secp256k1_fe *)&psVar8[-4].magnitude;
          psVar7 = psVar7 + -1;
        }
        (r->x).n[4] = u.n[4];
        (r->x).magnitude = u.magnitude;
        (r->x).normalized = u.normalized;
        (r->x).n[2] = u.n[2];
        (r->x).n[3] = u.n[3];
        (r->x).n[0] = u.n[0];
        (r->x).n[1] = u.n[1];
        psVar7 = r;
        sVar9 = len;
        while (bVar11 = sVar9 != 0, sVar9 = sVar9 - 1, bVar11) {
          secp256k1_ge_set_gej_zinv(psVar7,a,&psVar7->x);
          psVar7 = psVar7 + 1;
          a = a + 1;
        }
        while (bVar11 = len != 0, len = len - 1, bVar11) {
          secp256k1_ge_verify(r);
          r = r + 1;
        }
      }
      return;
    }
    secp256k1_gej_verify(a_00);
    iVar6 = secp256k1_gej_is_infinity(a_00);
    a_00 = a_00 + 1;
  } while (iVar6 == 0);
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/group_impl.h"
          ,0xcc,"test condition failed: !secp256k1_gej_is_infinity(&a[i])");
  abort();
}

Assistant:

static void secp256k1_ge_set_all_gej(secp256k1_ge *r, const secp256k1_gej *a, size_t len) {
    secp256k1_fe u;
    size_t i;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GEJ_VERIFY(&a[i]);
        VERIFY_CHECK(!secp256k1_gej_is_infinity(&a[i]));
    }
#endif

    if (len == 0) {
        return;
    }

    /* Use destination's x coordinates as scratch space */
    r[0].x = a[0].z;
    for (i = 1; i < len; i++) {
        secp256k1_fe_mul(&r[i].x, &r[i - 1].x, &a[i].z);
    }
    secp256k1_fe_inv(&u, &r[len - 1].x);

    for (i = len - 1; i > 0; i--) {
        secp256k1_fe_mul(&r[i].x, &r[i - 1].x, &u);
        secp256k1_fe_mul(&u, &u, &a[i].z);
    }
    r[0].x = u;

    for (i = 0; i < len; i++) {
        secp256k1_ge_set_gej_zinv(&r[i], &a[i], &r[i].x);
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&r[i]);
    }
#endif
}